

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O2

void __thiscall Emulator::~Emulator(Emulator *this)

{
  ~Emulator(this);
  operator_delete(this);
  return;
}

Assistant:

Emulator::~Emulator() {
    thread.join();
    delete sound_queue;
    SDL_FreeSurface(surface);
    SDL_DestroyWindow(window);
    SDL_DestroyRenderer(renderer);
    SDL_Quit();
}